

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

int __thiscall cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  pointer pLVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  cmTarget *pcVar5;
  char *pcVar6;
  DependSetList *pDVar7;
  _Rb_tree_color _Var8;
  pointer pLVar9;
  BFSEntry qe;
  BFSEntry qe_1;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LinkEntryIndex)._M_t,&item->super_string);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar4 = AllocateLinkEntry(this,&item->super_string);
    _Var8 = iVar4._M_node[2]._M_color;
    pLVar1 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar9 = pLVar1 + (int)_Var8;
    std::__cxx11::string::_M_assign((string *)pLVar9);
    pcVar5 = item->Target;
    pLVar1[(int)_Var8].Target = pcVar5;
    if (((pcVar5 == (cmTarget *)0x0) &&
        (pcVar6 = (item->super_string)._M_dataplus._M_p, *pcVar6 == '-')) && (pcVar6[1] != 'l')) {
      std::__cxx11::string::substr((ulong)&qe,(ulong)item);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &qe,"-framework");
      pLVar9->IsFlag = bVar2;
      std::__cxx11::string::~string((string *)&qe);
      pcVar5 = pLVar9->Target;
    }
    else {
      pLVar9->IsFlag = false;
    }
    if (pcVar5 == (cmTarget *)0x0) {
      std::__cxx11::string::string((string *)&qe,(string *)pLVar9);
      std::__cxx11::string::append((char *)&qe);
      pcVar6 = cmMakefile::GetDefinition(this->Makefile,(string *)&qe);
      if (pcVar6 == (char *)0x0) {
        if (pLVar9->IsFlag == false) {
          pDVar7 = (DependSetList *)operator_new(0x18);
          *(pointer *)
           ((long)&(pDVar7->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 0x10) = (pointer)0x0;
          *(undefined8 *)
           &(pDVar7->
            super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ).
            super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ._M_impl = 0;
          *(pointer *)
           ((long)&(pDVar7->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 8) = (pointer)0x0;
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)_Var8] = pDVar7;
        }
      }
      else {
        qe_1.Index = _Var8;
        qe_1.LibDepends = pcVar6;
        std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ::push_back(&(this->BFSQueue).c,&qe_1);
      }
      std::__cxx11::string::~string((string *)&qe);
    }
    else {
      qe.LibDepends = (char *)0x0;
      qe.Index = _Var8;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      push_back(&(this->BFSQueue).c,&qe);
    }
  }
  else {
    _Var8 = iVar3._M_node[2]._M_color;
  }
  return _Var8;
}

Assistant:

int cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item)
{
  // Check if the item entry has already been added.
  std::map<std::string, int>::iterator lei = this->LinkEntryIndex.find(item);
  if(lei != this->LinkEntryIndex.end())
    {
    // Yes.  We do not need to follow the item's dependencies again.
    return lei->second;
    }

  // Allocate a spot for the item entry.
  lei = this->AllocateLinkEntry(item);

  // Initialize the item entry.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = item;
  entry.Target = item.Target;
  entry.IsFlag = (!entry.Target && item[0] == '-' && item[1] != 'l' &&
                  item.substr(0, 10) != "-framework");

  // If the item has dependencies queue it to follow them.
  if(entry.Target)
    {
    // Target dependencies are always known.  Follow them.
    BFSEntry qe = {index, 0};
    this->BFSQueue.push(qe);
    }
  else
    {
    // Look for an old-style <item>_LIB_DEPENDS variable.
    std::string var = entry.Item;
    var += "_LIB_DEPENDS";
    if(const char* val = this->Makefile->GetDefinition(var))
      {
      // The item dependencies are known.  Follow them.
      BFSEntry qe = {index, val};
      this->BFSQueue.push(qe);
      }
    else if(!entry.IsFlag)
      {
      // The item dependencies are not known.  We need to infer them.
      this->InferredDependSets[index] = new DependSetList;
      }
    }

  return index;
}